

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

bool __thiscall
cs_impl::any::holder<cs::callable>::compare(holder<cs::callable> *this,baseHolder *obj)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  callable *a;
  holder<cs::callable> *in_RSI;
  type_info *in_RDI;
  callable *in_stack_ffffffffffffffc8;
  bool local_1;
  type_info *this_00;
  
  iVar2 = (*(in_RSI->super_baseHolder)._vptr_baseHolder[2])();
  this_00 = (type_info *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*(long *)in_RDI + 0x10))();
  bVar1 = std::type_info::operator==(this_00,in_RDI);
  if (bVar1) {
    a = (callable *)(in_RDI + 8);
    data(in_RSI);
    local_1 = compare<cs::callable>(a,in_stack_ffffffffffffffc8);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}